

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_outputAndInputParameter_Test::testBody
          (TEST_MockParameterTest_outputAndInputParameter_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  MockExpectedCall *pMVar3;
  undefined4 extraout_var_00;
  MockActualCall *pMVar4;
  UtestShell *pUVar5;
  long lVar6;
  TestTerminator *pTVar7;
  SimpleString local_b8;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  int local_18 [2];
  int returned_value;
  int return_value;
  TEST_MockParameterTest_outputAndInputParameter_Test *this_local;
  
  local_18[1] = 5;
  local_18[0] = 7;
  _returned_value = this;
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_48);
  SimpleString::SimpleString(&local_58,"bar");
  pMVar3 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var,iVar1),&local_58,10);
  SimpleString::SimpleString(&local_68,"bar");
  (*pMVar3->_vptr_MockExpectedCall[6])(pMVar3,&local_68,local_18 + 1,4);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_78,"");
  pMVar2 = mock(&local_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_88,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_88);
  SimpleString::SimpleString(&local_98,"bar");
  pMVar4 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_00,iVar1),&local_98,10);
  SimpleString::SimpleString(&local_a8,"bar");
  (*pMVar4->_vptr_MockActualCall[5])(pMVar4,&local_a8,local_18);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  pUVar5 = UtestShell::getCurrent();
  lVar6 = (long)local_18[0];
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,5,lVar6,"LONGS_EQUAL(5, returned_value) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x338,pTVar7);
  SimpleString::SimpleString(&local_b8,"");
  pMVar2 = mock(&local_b8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_b8);
  return;
}

Assistant:

TEST(MockParameterTest, outputAndInputParameter)
{
    int return_value = 5;
    int returned_value = 7;

    mock().expectOneCall("foo").withParameter("bar", 10).withOutputParameterReturning("bar", &return_value, sizeof(return_value));
    mock().actualCall("foo").withParameter("bar", 10).withOutputParameter("bar", &returned_value);

    LONGS_EQUAL(5, returned_value);
    mock().checkExpectations();
}